

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

LispPTR DSK_directorynamep(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  DLword *pDVar8;
  LispPTR LVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  char dirname [4096];
  char fullname [4096];
  char local_2028 [4096];
  char local_1028 [4096];
  
  pcVar10 = local_2028;
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 == 0) {
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    Lisp_errno = (int *)(Lisp_world + uVar2);
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
      lVar7 = 5;
LAB_0011e7a9:
      if (0xffe < (ulong)(iVar4 + lVar7)) {
        *Lisp_errno = 200;
        goto LAB_0011e716;
      }
    }
    else {
      if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
        iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
        lVar7 = 3;
        goto LAB_0011e7a9;
      }
      error("LispStringLength: Not a character array.\n");
    }
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
    iVar5 = 0x1000;
    if (iVar4 < 0x1000) {
      iVar5 = iVar4;
    }
    lVar7 = (long)iVar5;
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      pcVar11 = local_2028;
      if (iVar4 != 0) {
        lVar7 = lVar7 + (ulong)(lVar7 == 0);
        pDVar8 = Lisp_world +
                 (ulong)Lisp_world[(ulong)uVar2 + 2] +
                 (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
        do {
          *pcVar10 = *(undefined1 *)((ulong)pDVar8 ^ 2);
          pcVar10 = pcVar10 + 1;
          pDVar8 = pDVar8 + 1;
          lVar7 = lVar7 + -1;
          pcVar11 = pcVar10;
        } while (lVar7 != 0);
      }
      *pcVar11 = 0;
    }
    else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      if (iVar4 != 0) {
        uVar3 = *(uint *)(Lisp_world + uVar2);
        uVar1 = Lisp_world[(ulong)uVar2 + 2];
        lVar12 = 0;
        do {
          local_2028[lVar12] =
               *(char *)((long)Lisp_world + lVar12 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^
                        3);
          lVar12 = lVar12 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar12);
      }
      local_2028[lVar7] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    LVar9 = 0;
    iVar4 = unixpathname(local_2028,local_1028,1,0);
    if ((iVar4 != 0) && (iVar4 = true_name(local_1028), iVar4 == -1)) {
      LVar9 = 0;
      iVar4 = lisppathname(local_1028,local_2028,1,0);
      if (iVar4 != 0) {
        sVar6 = strlen(local_2028);
        uVar2 = args[1];
        if ((uVar2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        pDVar8 = Lisp_world;
        if (sVar6 != 0xffffffffffffffff) {
          uVar2 = *(uint *)(Lisp_world + uVar2);
          lVar7 = 0;
          do {
            *(char *)((long)pDVar8 + lVar7 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = local_2028[lVar7]
            ;
            lVar7 = lVar7 + 1;
          } while (sVar6 + 1 != lVar7);
          if (sVar6 < 0x10000) {
            return (uint)sVar6 | 0xe0000;
          }
        }
        error("Not Smallp data");
        LVar9 = 0xe0000;
      }
    }
  }
  else {
    *Lisp_errno = 100;
LAB_0011e716:
    LVar9 = 0;
  }
  return LVar9;
}

Assistant:

LispPTR DSK_directorynamep(LispPTR *args)
{
  char dirname[MAXPATHLEN];
  char fullname[MAXPATHLEN];
  size_t len;
  int fatp;
  char *base;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  /* -2 for the initial and trail directory delimiter. */
  if (len > MAXPATHLEN - 2) FileNameTooLong(NIL);

  LispStringToCString(args[0], dirname, MAXPATHLEN);

/* Convert Xerox Lisp file naming convention to Unix one. */
#ifdef DOS
  separate_drive(dirname, drive);
  if (unixpathname(dirname, fullname, 1, 0, drive, 0, 0) == 0) return (NIL);
#else  /* DOS*/
  if (unixpathname(dirname, fullname, 1, 0) == 0) return (NIL);
#endif /* DOS */

  if (true_name(fullname) != -1) return (NIL);

  /* Convert Unix file naming convention to Xerox Lisp one. */
  if (lisppathname(fullname, dirname, 1, 0) == 0) return (NIL);

  len = strlen(dirname);
  STRING_BASE(args[1], base);

#ifndef BYTESWAP
  strncpy(base, dirname, len + 1);
#else
  StrNCpyFromCToLisp(base, dirname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}